

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

void TTD::NSSnapObjects::StdPropertyRestore
               (SnapObject *snpObject,DynamicObject *obj,InflateMap *inflator)

{
  char cVar1;
  byte bVar2;
  PropertyId propertyId;
  InflateMap *pIVar3;
  bool bVar4;
  int iVar5;
  DynamicType *pDVar6;
  DynamicTypeHandler *pDVar7;
  Var aValue;
  Type *this;
  SnapHandler *pSVar8;
  ScriptContext *requestContext;
  RecyclableObject *aValue_00;
  JavascriptArray *objArray_00;
  Var local_78;
  Var objArray;
  PropertyAttributes pAttrib;
  Var pvStack_60;
  SnapEntryDataKindTag ttag;
  Var currentValue;
  Var pvStack_50;
  BOOL success_1;
  Var pVal;
  TTDVar ttdVal;
  PropertyId local_38;
  BOOL success;
  PropertyId pid;
  uint32 i;
  SnapHandler *handler;
  RecyclableObject *protoObj;
  InflateMap *inflator_local;
  DynamicObject *obj_local;
  SnapObject *snpObject_local;
  
  protoObj = (RecyclableObject *)inflator;
  inflator_local = (InflateMap *)obj;
  obj_local = (DynamicObject *)snpObject;
  pDVar6 = Js::DynamicObject::GetDynamicType(obj);
  pDVar7 = Js::DynamicType::GetTypeHandler(pDVar6);
  (*pDVar7->_vptr_DynamicTypeHandler[0x10])(pDVar7,inflator_local);
  if ((obj_local->auxSlots).ptr[2].ptr != (void *)0x0) {
    aValue = InflateMap::InflateTTDVar((InflateMap *)protoObj,(obj_local->auxSlots).ptr[2].ptr);
    handler = (SnapHandler *)Js::VarTo<Js::RecyclableObject>(aValue);
    this = Js::RecyclableObject::GetType((RecyclableObject *)inflator_local);
    pSVar8 = (SnapHandler *)Js::Type::GetPrototype(this);
    if (pSVar8 != handler) {
      (**(code **)(*(long *)&inflator_local->m_handlerMap + 600))(inflator_local,handler);
    }
  }
  _pid = (obj_local->auxSlots).ptr[4].ptr;
  for (success = 0; (uint)success < *(uint *)((long)_pid + 0x10); success = success + 1) {
    if (*(char *)(*(long *)((long)_pid + 0x18) + 4 + (ulong)(uint)success * 8) != '\0') {
      bVar4 = Js::VarIs<Js::JavascriptProxy,Js::DynamicObject>((DynamicObject *)inflator_local);
      if (bVar4) {
        TTDAbort_unrecoverable_error
                  ("I didn\'t think proxies could have real properties directly on them.");
      }
      local_38 = *(PropertyId *)(*(long *)((long)_pid + 0x18) + (ulong)(uint)success * 8);
      if (*(char *)(*(long *)((long)_pid + 0x18) + 4 + (ulong)(uint)success * 8) == '\x01') {
        iVar5 = (**(code **)(*(long *)&inflator_local->m_handlerMap + 0x60))
                          (inflator_local,local_38);
        if (iVar5 != 0) {
          TTDAbort_unrecoverable_error
                    (
                    "Shouldn\'t have this defined, or we should have cleared it, and nothing more to do."
                    );
        }
        ttdVal._4_4_ = (**(code **)(*(long *)&inflator_local->m_handlerMap + 0xe0))
                                 (inflator_local,local_38);
        if (ttdVal._4_4_ == 0) {
          TTDAbort_unrecoverable_error("Failed to set property during restore!!!");
        }
      }
      else {
        pVal = *(Var *)(&(obj_local[1].super_RecyclableObject.type.ptr)->typeId +
                       (ulong)(uint)success * 2);
        if (pVal == (TTDVar)0x0) {
          local_78 = (Var)0x0;
        }
        else {
          local_78 = InflateMap::InflateTTDVar((InflateMap *)protoObj,pVal);
        }
        pvStack_50 = local_78;
        if (*(char *)(*(long *)((long)_pid + 0x18) + 4 + (ulong)(uint)success * 8) == '\x02') {
          currentValue._4_4_ = 0;
          iVar5 = (**(code **)(*(long *)&inflator_local->m_handlerMap + 0x60))
                            (inflator_local,local_38);
          pIVar3 = inflator_local;
          propertyId = local_38;
          if (iVar5 == 0) {
            currentValue._4_4_ =
                 (**(code **)(*(long *)&inflator_local->m_handlerMap + 0xf0))
                           (inflator_local,local_38,pvStack_50,7,0,0,0xf);
          }
          else {
            pvStack_60 = (Var)0x0;
            requestContext =
                 Js::RecyclableObject::GetScriptContext((RecyclableObject *)inflator_local);
            Js::JavascriptOperators::GetOwnProperty
                      (pIVar3,propertyId,&stack0xffffffffffffffa0,requestContext,
                       (PropertyValueInfo *)0x0);
            if (pvStack_60 == pvStack_50) {
              currentValue._4_4_ = 1;
            }
            else {
              currentValue._4_4_ =
                   (**(code **)(*(long *)&inflator_local->m_handlerMap + 0xf0))
                             (inflator_local,local_38,pvStack_50,7,0,0,0xf);
            }
          }
          if (currentValue._4_4_ == 0) {
            TTDAbort_unrecoverable_error("Failed to set property during restore!!!");
          }
        }
        else {
          cVar1 = *(char *)(*(long *)((long)_pid + 0x18) + 4 + (ulong)(uint)success * 8);
          if (cVar1 == '\x03') {
            (**(code **)(*(long *)&inflator_local->m_handlerMap + 0x168))
                      (inflator_local,local_38,local_78,0);
          }
          else {
            if (cVar1 != '\x04') {
              TTDAbort_unrecoverable_error("Don\'t know how to restore this accesstag!!");
            }
            (**(code **)(*(long *)&inflator_local->m_handlerMap + 0x168))
                      (inflator_local,local_38,0,local_78,0);
          }
        }
      }
      bVar2 = *(byte *)(*(long *)((long)_pid + 0x18) + 5 + (ulong)(uint)success * 8);
      iVar5 = (**(code **)(*(long *)&inflator_local->m_handlerMap + 0x180))(inflator_local,local_38)
      ;
      if ((iVar5 != 0) && ((bVar2 & 4) == 0)) {
        (**(code **)(*(long *)&inflator_local->m_handlerMap + 0x1d8))(inflator_local,local_38,0);
      }
      iVar5 = (**(code **)(*(long *)&inflator_local->m_handlerMap + 400))(inflator_local,local_38);
      if ((iVar5 != 0) && ((bVar2 & 1) == 0)) {
        (**(code **)(*(long *)&inflator_local->m_handlerMap + 0x1e8))(inflator_local,local_38,0);
      }
      iVar5 = (**(code **)(*(long *)&inflator_local->m_handlerMap + 0x188))(inflator_local,local_38)
      ;
      if ((iVar5 != 0) && ((bVar2 & 2) == 0)) {
        (**(code **)(*(long *)&inflator_local->m_handlerMap + 0x1e0))(inflator_local,local_38,0);
      }
    }
  }
  if (obj_local[1].auxSlots.ptr != (WriteBarrierPtr<void> *)0x0) {
    aValue_00 = InflateMap::LookupObject
                          ((InflateMap *)protoObj,(TTD_PTR_ID)obj_local[1].auxSlots.ptr);
    pIVar3 = inflator_local;
    objArray_00 = Js::JavascriptArray::FromAnyArray(aValue_00);
    Js::DynamicObject::SetObjectArray((DynamicObject *)pIVar3,&objArray_00->super_ArrayObject);
  }
  if (*(char *)((long)_pid + 0x20) == '\x01') {
    bVar4 = Js::DynamicObject::GetIsExtensible((DynamicObject *)inflator_local);
    if (!bVar4) {
      pDVar6 = Js::DynamicObject::GetDynamicType((DynamicObject *)inflator_local);
      bVar4 = Js::DynamicType::GetIsShared(pDVar6);
      if (!bVar4) {
        pDVar6 = Js::DynamicObject::GetDynamicType((DynamicObject *)inflator_local);
        pDVar7 = Js::DynamicType::GetTypeHandler(pDVar6);
        bVar4 = Js::DynamicTypeHandler::GetIsShared(pDVar7);
        if (!bVar4) {
          pDVar6 = Js::DynamicObject::GetDynamicType((DynamicObject *)inflator_local);
          pDVar7 = Js::DynamicType::GetTypeHandler(pDVar6);
          Js::DynamicTypeHandler::SetExtensible_TTD(pDVar7);
          goto LAB_00d06a32;
        }
      }
      TTDAbort_unrecoverable_error
                (
                "We are just changing the flag so if it is shared this might unexpectedly change another type!"
                );
    }
  }
  else {
    pDVar6 = Js::DynamicObject::GetDynamicType((DynamicObject *)inflator_local);
    pDVar7 = Js::DynamicType::GetTypeHandler(pDVar6);
    (*pDVar7->_vptr_DynamicTypeHandler[0x36])(pDVar7,inflator_local);
  }
LAB_00d06a32:
  bVar2 = *(byte *)&(obj_local->auxSlots).ptr[5].ptr;
  pDVar6 = Js::DynamicObject::GetDynamicType((DynamicObject *)inflator_local);
  bVar4 = Js::DynamicType::GetHasNoEnumerableProperties(pDVar6);
  if ((bool)(bVar2 & 1) != bVar4) {
    pDVar6 = Js::DynamicObject::GetDynamicType((DynamicObject *)inflator_local);
    Js::DynamicType::SetHasNoEnumerableProperties
              (pDVar6,(bool)(*(byte *)&(obj_local->auxSlots).ptr[5].ptr & 1));
  }
  return;
}

Assistant:

void StdPropertyRestore(const SnapObject* snpObject, Js::DynamicObject* obj, InflateMap* inflator)
        {
            obj->GetDynamicType()->GetTypeHandler()->EnsureObjectReady(obj);

            //Many protos are set at creation, don't mess with them if they are already correct
            if(snpObject->SnapType->PrototypeVar != nullptr)
            {
                Js::RecyclableObject* protoObj = Js::VarTo<Js::RecyclableObject>(inflator->InflateTTDVar(snpObject->SnapType->PrototypeVar));
                if(obj->GetType()->GetPrototype() != protoObj)
                {
                    obj->SetPrototype(protoObj);
                }
            }

            //set all the standard properties
            const NSSnapType::SnapHandler* handler = snpObject->SnapType->TypeHandlerInfo;

#if ENABLE_OBJECT_SOURCE_TRACKING
            CopyDiagnosticOriginInformation(obj->TTDDiagOriginInfo, snpObject->DiagOriginInfo);
#endif

            //
            //We assume that placing properties back in the same order we read them out produces correct results.
            //This is not true for enumeration -- but we handle this by explicit logging
            //There may also be sensitivity in other cases -- e.g. activation objects with arguments objects that use slot index values directly.
            //    Things look good in this case but future changes may require care and/or adding special case handling.
            //
            for(uint32 i = 0; i < handler->MaxPropertyIndex; ++i)
            {
                //We have an empty (or uninteresting) slot for so there is nothing to restore
                if(handler->PropertyInfoArray[i].DataKind == NSSnapType::SnapEntryDataKindTag::Clear)
                {
                    continue;
                }

                TTDAssert(!Js::VarIs<Js::JavascriptProxy>(obj), "I didn't think proxies could have real properties directly on them.");

                Js::PropertyId pid = handler->PropertyInfoArray[i].PropertyRecordId;

                if(handler->PropertyInfoArray[i].DataKind == NSSnapType::SnapEntryDataKindTag::Uninitialized)
                {
                    TTDAssert(!obj->HasOwnProperty(pid), "Shouldn't have this defined, or we should have cleared it, and nothing more to do.");

                    BOOL success = obj->EnsureProperty(pid);

                    TTDAssert(success, "Failed to set property during restore!!!");
                }
                else
                {
                    TTDVar ttdVal = snpObject->VarArray[i];
                    Js::Var pVal = (ttdVal != nullptr) ? inflator->InflateTTDVar(ttdVal) : nullptr;

                    if(handler->PropertyInfoArray[i].DataKind == NSSnapType::SnapEntryDataKindTag::Data)
                    {
                        BOOL success = FALSE;
                        if(!obj->HasOwnProperty(pid))
                        {
                            //easy case just set the property
                            success = obj->SetPropertyWithAttributes(pid, pVal, PropertyDynamicTypeDefaults, nullptr);
                        }
                        else
                        {
                            //get the value to see if it is already ok
                            Js::Var currentValue = nullptr;
                            Js::JavascriptOperators::GetOwnProperty(obj, pid, &currentValue, obj->GetScriptContext(), nullptr);

                            if(currentValue == pVal)
                            {
                                //the right value is already there -- easy
                                success = TRUE;
                            }
                            else
                            {
                                //Ok so now we force set the property
                                success = obj->SetPropertyWithAttributes(pid, pVal, PropertyDynamicTypeDefaults, nullptr);
                            }
                        }

                        TTDAssert(success, "Failed to set property during restore!!!");
                    }
                    else
                    {
                        NSSnapType::SnapEntryDataKindTag ttag = handler->PropertyInfoArray[i].DataKind;
                        if(ttag == NSSnapType::SnapEntryDataKindTag::Getter)
                        {
                            obj->SetAccessors(pid, pVal, nullptr);
                        }
                        else if(ttag == NSSnapType::SnapEntryDataKindTag::Setter)
                        {
                            obj->SetAccessors(pid, nullptr, pVal);
                        }
                        else
                        {
                            TTDAssert(false, "Don't know how to restore this accesstag!!");
                        }
                    }
                }

                Js::PropertyAttributes pAttrib = (Js::PropertyAttributes)handler->PropertyInfoArray[i].AttributeInfo;
                if(obj->IsWritable(pid) && (pAttrib & PropertyWritable) == PropertyNone)
                {
                    obj->SetWritable(pid, FALSE);
                }

                if(obj->IsEnumerable(pid) && (pAttrib & PropertyEnumerable) == PropertyNone)
                {
                    obj->SetEnumerable(pid, FALSE);
                }

                if(obj->IsConfigurable(pid) && (pAttrib & PropertyConfigurable) == PropertyNone)
                {
                    obj->SetConfigurable(pid, FALSE);
                }
            }

            if(snpObject->OptIndexedObjectArray != TTD_INVALID_PTR_ID)
            {
                Js::Var objArray = inflator->LookupObject(snpObject->OptIndexedObjectArray);
                obj->SetObjectArray(Js::JavascriptArray::FromAnyArray(objArray));
            }

            //finally set the extensible flag
            if(handler->IsExtensibleFlag != Js::DynamicTypeHandler::IsExtensibleFlag)
            {
                //this automatically updates the type if needed
                obj->GetDynamicType()->GetTypeHandler()->PreventExtensions(obj);
            }
            else
            {
                if(!obj->GetIsExtensible())
                {
                    TTDAssert(!(obj->GetDynamicType()->GetIsShared() || obj->GetDynamicType()->GetTypeHandler()->GetIsShared()), "We are just changing the flag so if it is shared this might unexpectedly change another type!");

                    obj->GetDynamicType()->GetTypeHandler()->SetExtensible_TTD();
                }
            }

            if(snpObject->SnapType->HasNoEnumerableProperties != obj->GetDynamicType()->GetHasNoEnumerableProperties())
            {
                obj->GetDynamicType()->SetHasNoEnumerableProperties(snpObject->SnapType->HasNoEnumerableProperties);
            }
        }